

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBeamSectionCosserat.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChBeamSectionCosseratEasyRectangular::ChBeamSectionCosseratEasyRectangular
          (ChBeamSectionCosseratEasyRectangular *this,double width_y,double width_z,double E,
          double G,double density)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  double dVar1;
  shared_ptr<chrono::fea::ChElasticityCosseratSimple> melasticity;
  shared_ptr<chrono::fea::ChBeamSectionShapeRectangular> mdrawshape;
  undefined1 local_99;
  double local_98;
  double local_90;
  double local_88;
  double local_80;
  ChElasticityCosseratSimple *local_78;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_70;
  ChBeamSectionShapeRectangular *local_68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_60;
  double local_58;
  double local_50;
  ChBeamSectionShapeRectangular *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  element_type *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  ChElasticityCosseratSimple *local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  local_98 = E;
  local_90 = G;
  local_88 = width_z;
  local_80 = width_y;
  local_50 = density;
  ChBeamSection::ChBeamSection((ChBeamSection *)this);
  (this->super_ChBeamSectionCosserat).elasticity.
  super___shared_ptr<chrono::fea::ChElasticityCosserat,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->super_ChBeamSectionCosserat).elasticity.
  super___shared_ptr<chrono::fea::ChElasticityCosserat,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_ChBeamSectionCosserat).plasticity.
  super___shared_ptr<chrono::fea::ChPlasticityCosserat,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->super_ChBeamSectionCosserat).plasticity.
  super___shared_ptr<chrono::fea::ChPlasticityCosserat,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_ChBeamSectionCosserat).damping.
  super___shared_ptr<chrono::fea::ChDampingCosserat,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->super_ChBeamSectionCosserat).damping.
  super___shared_ptr<chrono::fea::ChDampingCosserat,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_ChBeamSectionCosserat).inertia.
  super___shared_ptr<chrono::fea::ChInertiaCosserat,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->super_ChBeamSectionCosserat).inertia.
  super___shared_ptr<chrono::fea::ChInertiaCosserat,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_ChBeamSectionCosserat).super_ChBeamSection._vptr_ChBeamSection =
       (_func_int **)&PTR__ChBeamSectionCosserat_00b4dd08;
  local_78 = (ChElasticityCosseratSimple *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chrono::fea::ChElasticityCosseratSimple,std::allocator<chrono::fea::ChElasticityCosseratSimple>>
            (&local_70,&local_78,(allocator<chrono::fea::ChElasticityCosseratSimple> *)&local_68);
  local_78->E = local_98;
  local_78->G = local_90;
  (*(local_78->super_ChElasticityCosserat)._vptr_ChElasticityCosserat[4])(local_80,local_88);
  local_28 = local_78;
  local_20._M_pi = local_70._M_pi;
  if (local_70._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_70._M_pi)->_M_use_count = (local_70._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_70._M_pi)->_M_use_count = (local_70._M_pi)->_M_use_count + 1;
    }
  }
  (this->super_ChBeamSectionCosserat).elasticity.
  super___shared_ptr<chrono::fea::ChElasticityCosserat,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_78->super_ChElasticityCosserat;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->super_ChBeamSectionCosserat).elasticity.
              super___shared_ptr<chrono::fea::ChElasticityCosserat,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,&local_20);
  ((this->super_ChBeamSectionCosserat).elasticity.
   super___shared_ptr<chrono::fea::ChElasticityCosserat,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
  section = &this->super_ChBeamSectionCosserat;
  if (local_20._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20._M_pi);
  }
  this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)::operator_new(0x48);
  this_00->_M_use_count = 1;
  this_00->_M_weak_count = 1;
  this_00->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00b4deb8;
  this_00[1]._M_use_count = 0;
  this_00[1]._M_weak_count = 0;
  *(undefined2 *)&this_00[2]._vptr__Sp_counted_base = 0x101;
  *(undefined1 *)((long)&this_00[2]._vptr__Sp_counted_base + 2) = 0;
  this_00[1]._vptr__Sp_counted_base = (_func_int **)&PTR__ChInertiaCosserat_00b4db90;
  this_00[2]._M_use_count = 0;
  this_00[2]._M_weak_count = 0x408f4000;
  this_00[3]._vptr__Sp_counted_base = (_func_int **)0x3ff0000000000000;
  this_00[3]._M_use_count = 0;
  this_00[3]._M_weak_count = 0x3ff00000;
  this_00[4]._vptr__Sp_counted_base = (_func_int **)0x3ff0000000000000;
  local_58 = local_80;
  local_90 = local_88;
  this_00[3]._vptr__Sp_counted_base = (_func_int **)(local_80 * local_88);
  local_98 = local_88 * 0.08333333333333333;
  dVar1 = pow(local_80,3.0);
  *(double *)&this_00[3]._M_use_count = dVar1 * local_98;
  local_98 = local_58 * 0.08333333333333333;
  dVar1 = pow(local_90,3.0);
  this_00[4]._vptr__Sp_counted_base = (_func_int **)(dVar1 * local_98);
  *(double *)&this_00[2]._M_use_count = local_50;
  if (__libc_single_threaded == '\0') {
    LOCK();
    this_00->_M_use_count = this_00->_M_use_count + 1;
    UNLOCK();
  }
  else {
    this_00->_M_use_count = this_00->_M_use_count + 1;
  }
  (this->super_ChBeamSectionCosserat).inertia.
  super___shared_ptr<chrono::fea::ChInertiaCosserat,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(this_00 + 1);
  local_38 = (element_type *)(this_00 + 1);
  local_30._M_pi = this_00;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->super_ChBeamSectionCosserat).inertia.
              super___shared_ptr<chrono::fea::ChInertiaCosserat,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,&local_30);
  ((this->super_ChBeamSectionCosserat).inertia.
   super___shared_ptr<chrono::fea::ChInertiaCosserat,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->section =
       &this->super_ChBeamSectionCosserat;
  if (local_30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30._M_pi);
  }
  local_68 = (ChBeamSectionShapeRectangular *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chrono::fea::ChBeamSectionShapeRectangular,std::allocator<chrono::fea::ChBeamSectionShapeRectangular>,double&,double&>
            (&local_60,&local_68,(allocator<chrono::fea::ChBeamSectionShapeRectangular> *)&local_99,
             &local_80,&local_88);
  local_48 = local_68;
  local_40._M_pi = local_60._M_pi;
  if (local_60._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_60._M_pi)->_M_use_count = (local_60._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_60._M_pi)->_M_use_count = (local_60._M_pi)->_M_use_count + 1;
    }
  }
  (this->super_ChBeamSectionCosserat).super_ChBeamSection.draw_shape.
  super___shared_ptr<chrono::fea::ChBeamSectionShape,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_68->super_ChBeamSectionShape;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->super_ChBeamSectionCosserat).super_ChBeamSection.draw_shape.
              super___shared_ptr<chrono::fea::ChBeamSectionShape,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,&local_40);
  if (local_40._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40._M_pi);
  }
  if (local_60._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_60._M_pi);
  }
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  if (local_70._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_70._M_pi);
  }
  return;
}

Assistant:

ChBeamSectionCosseratEasyRectangular::ChBeamSectionCosseratEasyRectangular(
    double width_y,  // width of section in y direction
    double width_z,  // width of section in z direction
    double E,        // Young modulus
    double G,        // shear modulus
    double density   // volumetric density (ex. in SI units: [kg/m])
) {
    auto melasticity = chrono_types::make_shared<ChElasticityCosseratSimple>();
    melasticity->SetYoungModulus(E);
    melasticity->SetGshearModulus(G);
    melasticity->SetAsRectangularSection(width_y, width_z);
    this->SetElasticity(melasticity);

    auto minertia = chrono_types::make_shared<ChInertiaCosseratSimple>();
    minertia->SetAsRectangularSection(width_y, width_z, density);
    this->SetInertia(minertia);

    auto mdrawshape = chrono_types::make_shared<ChBeamSectionShapeRectangular>(width_y, width_z);
    this->SetDrawShape(mdrawshape);
}